

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::anon_unknown_5::IsInstalledProtoPath
          (anon_unknown_5 *this,string_view path)

{
  int iVar1;
  string file_path;
  undefined1 local_90 [80];
  AlphaNum local_40;
  
  local_40.piece_._M_str = (char *)path._M_len;
  local_40.piece_._M_len = (size_t)this;
  local_90._32_16_ =
       (undefined1  [16])absl::lts_20240722::NullSafeStringView("/google/protobuf/descriptor.proto")
  ;
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_90,&local_40);
  iVar1 = access((char *)local_90._0_8_,0);
  std::__cxx11::string::~string((string *)local_90);
  return iVar1 != -1;
}

Assistant:

bool IsInstalledProtoPath(absl::string_view path) {
  // Checking the descriptor.proto file should be good enough.
  std::string file_path =
      absl::StrCat(path, "/google/protobuf/descriptor.proto");
  return access(file_path.c_str(), F_OK) != -1;
}